

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_text.cpp
# Opt level: O0

void __thiscall
GameText::GameText(GameText *this,string *text,string *name,uint8_t lines_in_textbox)

{
  bool bVar1;
  byte bVar2;
  reference pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  char local_71;
  iterator iStack_70;
  char c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  undefined1 local_48 [8];
  string full_name;
  uint8_t lines_in_textbox_local;
  string *name_local;
  string *text_local;
  GameText *this_local;
  
  full_name.field_2._M_local_buf[0xf] = lines_in_textbox;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->_output_text);
  this->_current_line_length = 0;
  this->_current_line_count = '\0';
  this->_lines_in_textbox = full_name.field_2._M_local_buf[0xf];
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,name,
                 ": ");
  __end1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48)
  ;
  iStack_70 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_48);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      (&__end1,&stack0xffffffffffffff90);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_71 = *pcVar3;
    bVar2 = character_width(local_71);
    this->_current_line_length = this->_current_line_length + (ushort)bVar2;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (name);
  if (bVar1) {
    GameText::text(this,text);
  }
  else {
    std::operator+(&local_98,"\x1c",text);
    GameText::text(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

GameText::GameText(const std::string& text, const std::string& name, uint8_t lines_in_textbox) :
    _lines_in_textbox(lines_in_textbox)
{
    std::string full_name = name + ": ";
    for(char c : full_name)
        _current_line_length += character_width(c);

    if(!name.empty())
        this->text("\u001c" + text);
    else
        this->text(text);
}